

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tinyxml.cpp
# Opt level: O2

bool __thiscall
despot::util::tinyxml::TiXmlPrinter::VisitExit(TiXmlPrinter *this,TiXmlElement *element)

{
  TiXmlString *this_00;
  
  this->depth = this->depth + -1;
  if ((element->super_TiXmlNode).firstChild != (TiXmlNode *)0x0) {
    if (this->simpleTextPrint == true) {
      this->simpleTextPrint = false;
    }
    else {
      DoIndent(this);
    }
    this_00 = &this->buffer;
    TiXmlString::operator+=(this_00,"</");
    TiXmlString::operator+=(this_00,((element->super_TiXmlNode).value.rep_)->str);
    TiXmlString::operator+=(this_00,">");
    DoLineBreak(this);
  }
  return true;
}

Assistant:

bool TiXmlPrinter::VisitExit(const TiXmlElement& element) {
	--depth;
	if (!element.FirstChild()) {
		// nothing.
	} else {
		if (simpleTextPrint) {
			simpleTextPrint = false;
		} else {
			DoIndent();
		}
		buffer += "</";
		buffer += element.Value();
		buffer += ">";
		DoLineBreak();
	}
	return true;
}